

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_270a50::WriterThread::run(WriterThread *this)

{
  lock_guard<std::mutex> lock;
  double dVar1;
  
  while( true ) {
    std::mutex::lock((mutex *)(anonymous_namespace)::scanlineMutex);
    if ((anonymous_namespace)::remainingScanlines == 0) break;
    dVar1 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)&(anonymous_namespace)::rand1,0.0,
                       (double)(anonymous_namespace)::remainingScanlines);
    Imf_3_2::RgbaOutputFile::writePixels((int)this->_outfile);
    (anonymous_namespace)::remainingScanlines =
         (anonymous_namespace)::remainingScanlines - (int)(dVar1 + 0.5);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
  IlmThread_3_2::Semaphore::post();
  return;
}

Assistant:

void
WriterThread::run ()
{

    while (true)
    {
        std::lock_guard<std::mutex> lock (scanlineMutex);

        if (remainingScanlines)
        {
            int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
            _outfile->writePixels (n);
            remainingScanlines -= n;
        }
        else
        {
            break;
        }
    }

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}